

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalArrowCollector::Sink
          (PhysicalArrowCollector *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>,_true> *this_00;
  _Head_base<0UL,_duckdb::ArrowAppender_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ArrowAppender_*,_false> _Var2;
  idx_t input_size;
  PhysicalArrowCollector *pPVar3;
  vector<duckdb::LogicalType,_true> *args;
  ExecutionContext *pEVar4;
  pointer pAVar5;
  ulong uVar6;
  pointer *__ptr;
  ulong uVar7;
  idx_t from;
  unsigned_long initial_capacity;
  ClientProperties properties;
  _Head_base<0UL,_duckdb::ArrowAppender_*,_false> local_d8;
  idx_t local_d0;
  PhysicalArrowCollector *local_c8;
  vector<duckdb::LogicalType,_true> *local_c0;
  ExecutionContext *local_b8;
  ArrowCollectorLocalState *local_b0;
  DataChunk *local_a8;
  ulong local_a0;
  ClientProperties local_98;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_b0 = (ArrowCollectorLocalState *)input->local_state;
  local_d0 = chunk->count;
  this_00 = &local_b0->appender;
  local_c0 = &(this->super_PhysicalResultCollector).super_PhysicalOperator.types;
  from = 0;
  local_c8 = this;
  local_b8 = context;
  local_a8 = chunk;
  do {
    pEVar4 = local_b8;
    if ((this_00->
        super_unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>)._M_t.
        super___uniq_ptr_impl<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ArrowAppender_*,_std::default_delete<duckdb::ArrowAppender>_>
        .super__Head_base<0UL,_duckdb::ArrowAppender_*,_false>._M_head_impl == (ArrowAppender *)0x0)
    {
      ClientContext::GetClientProperties(&local_98,local_b8->client);
      args = local_c0;
      local_a0 = local_d0 - from;
      if (local_c8->record_batch_size < local_d0 - from) {
        local_a0 = local_c8->record_batch_size;
      }
      ArrowTypeExtensionData::GetExtensionTypes
                ((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                  *)&local_68,pEVar4->client,local_c0);
      make_uniq<duckdb::ArrowAppender,duckdb::vector<duckdb::LogicalType,true>const&,unsigned_long&,duckdb::ClientProperties&,std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>>>
                ((duckdb *)&local_d8,args,&local_a0,&local_98,
                 (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                  *)&local_68);
      _Var2._M_head_impl = local_d8._M_head_impl;
      local_d8._M_head_impl = (ArrowAppender *)0x0;
      _Var1._M_head_impl =
           (this_00->
           super_unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>).
           _M_t.
           super___uniq_ptr_impl<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ArrowAppender_*,_std::default_delete<duckdb::ArrowAppender>_>
           .super__Head_base<0UL,_duckdb::ArrowAppender_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ArrowAppender_*,_std::default_delete<duckdb::ArrowAppender>_>.
      super__Head_base<0UL,_duckdb::ArrowAppender_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var1._M_head_impl != (ArrowAppender *)0x0) {
        ArrowAppender::~ArrowAppender(_Var1._M_head_impl);
        operator_delete(_Var1._M_head_impl);
      }
      _Var1._M_head_impl = local_d8._M_head_impl;
      if (local_d8._M_head_impl != (ArrowAppender *)0x0) {
        ArrowAppender::~ArrowAppender(local_d8._M_head_impl);
        operator_delete(_Var1._M_head_impl);
      }
      local_d8._M_head_impl = (ArrowAppender *)0x0;
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.time_zone._M_dataplus._M_p != &local_98.time_zone.field_2) {
        operator_delete(local_98.time_zone._M_dataplus._M_p);
      }
    }
    pAVar5 = unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>,_true>::
             operator->(this_00);
    pPVar3 = local_c8;
    input_size = local_d0;
    uVar6 = local_c8->record_batch_size - pAVar5->row_count;
    uVar7 = local_d0 - from;
    if (uVar6 < local_d0 - from) {
      uVar7 = uVar6;
    }
    pAVar5 = unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>,_true>::
             operator->(this_00);
    uVar7 = uVar7 + from;
    ArrowAppender::Append(pAVar5,local_a8,from,uVar7,input_size);
    pAVar5 = unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>,_true>::
             operator->(this_00);
    if (pPVar3->record_batch_size <= pAVar5->row_count) {
      ArrowCollectorLocalState::FinishArray(local_b0);
    }
    from = uVar7;
  } while (uVar7 < local_d0);
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalArrowCollector::Sink(ExecutionContext &context, DataChunk &chunk,
                                            OperatorSinkInput &input) const {
	auto &lstate = input.local_state.Cast<ArrowCollectorLocalState>();
	// Append to the appender, up to chunk size

	auto count = chunk.size();
	auto &appender = lstate.appender;
	D_ASSERT(count != 0);

	idx_t processed = 0;
	do {
		if (!appender) {
			// Create the appender if we haven't started this chunk yet
			auto properties = context.client.GetClientProperties();
			D_ASSERT(processed < count);
			auto initial_capacity = MinValue(record_batch_size, count - processed);
			appender = make_uniq<ArrowAppender>(types, initial_capacity, properties,
			                                    ArrowTypeExtensionData::GetExtensionTypes(context.client, types));
		}

		// Figure out how much we can still append to this chunk
		auto row_count = appender->RowCount();
		D_ASSERT(record_batch_size > row_count);
		auto to_append = MinValue(record_batch_size - row_count, count - processed);

		// Append and check if the chunk is finished
		appender->Append(chunk, processed, processed + to_append, count);
		processed += to_append;
		row_count = appender->RowCount();
		if (row_count >= record_batch_size) {
			lstate.FinishArray();
		}
	} while (processed < count);
	return SinkResultType::NEED_MORE_INPUT;
}